

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstrlib.c
# Opt level: O0

int nospecials(char *p,size_t l)

{
  char *pcVar1;
  size_t sVar2;
  ulong local_28;
  size_t upto;
  size_t l_local;
  char *p_local;
  
  local_28 = 0;
  do {
    pcVar1 = strpbrk(p + local_28,"^$*+?.([%-");
    if (pcVar1 != (char *)0x0) {
      return 0;
    }
    sVar2 = strlen(p + local_28);
    local_28 = sVar2 + 1 + local_28;
  } while (local_28 <= l);
  return 1;
}

Assistant:

static int nospecials (const char *p, size_t l) {
  size_t upto = 0;
  do {
    if (strpbrk(p + upto, SPECIALS))
      return 0;  /* pattern has a special character */
    upto += strlen(p + upto) + 1;  /* may have more after \0 */
  } while (upto <= l);
  return 1;  /* no special chars found */
}